

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  BaseEmitter *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  Error EVar4;
  uint uVar5;
  InstId IVar6;
  InstId IVar7;
  byte bVar8;
  bool bVar9;
  Operand dst;
  Operand src;
  
  if (((byte)(typeId + ~_kVec512End) < 0xbb) || ((typeId & 0x7e) == _kBaseStart)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86emithelper.cpp"
               ,0x44,"TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId)");
  }
  uVar2._0_4_ = (dst_->_signature)._bits;
  uVar2._4_4_ = dst_->_baseId;
  dst.super_Operand_._data = *&dst_->_data;
  uVar3._0_4_ = (src_->_signature)._bits;
  uVar3._4_4_ = src_->_baseId;
  src.super_Operand_._data = *&src_->_data;
  bVar8 = (uVar2._0_4_ & 7) == 2;
  dst.super_Operand_._0_8_ = uVar2;
  if ((bool)bVar8) {
    uVar2._0_4_ = uVar2._0_4_ & 0xfffffa | uVar3._0_4_ & 0xff000000;
    dst.super_Operand_._baseId = uVar2._4_4_;
    dst.super_Operand_._signature._bits = uVar2._0_4_;
  }
  src.super_Operand_._0_8_ = uVar3;
  if ((uVar3._0_4_ & 7) == 2) {
    bVar8 = bVar8 | 2;
    uVar3._0_4_ = uVar3._0_4_ & 0xfffffa | uVar2._0_4_ & 0xff000000;
    src.super_Operand_._baseId = uVar3._4_4_;
    src.super_Operand_._signature._bits = uVar3._0_4_;
  }
  IVar6 = 0x1b7;
  IVar7 = 0x1b7;
  switch(typeId) {
  case kInt8:
  case kUInt8:
  case kInt16:
  case kUInt16:
    if ((bVar8 & 2) != 0) {
      dst.super_Operand_._signature._bits = 0x4000031;
      IVar7 = 0x1de;
      break;
    }
    if (bVar8 != 0) break;
    uVar2._0_4_ = 0x4000031;
    dst.super_Operand_._signature._bits = 0x4000031;
    goto LAB_0013d604;
  case kInt32:
  case kUInt32:
  case kInt64:
  case _kIntEnd:
    break;
  default:
    cVar1 = TypeUtils::_typeData[typeId];
    if (bVar8 == 0 || 9 < (byte)(typeId - _kVec32Start)) {
      if (9 < (byte)(typeId - _kVec64Start) || bVar8 == 0) {
        if (cVar1 == '+') {
          bVar9 = this->_avxEnabled == false;
          IVar6 = 0x4a8;
          IVar7 = 0x1b9;
        }
        else if (cVar1 == '*') {
          bVar9 = this->_avxEnabled == false;
          IVar6 = 0x4a9;
          IVar7 = 0x1ba;
        }
        else {
          IVar7 = 0x4ad;
          if (this->_avx512Enabled != false) break;
          bVar9 = this->_avxEnabled == false;
          IVar6 = 0x4ac;
          IVar7 = 0x1c1;
        }
        if (!bVar9) {
          IVar7 = IVar6;
        }
        break;
      }
      bVar9 = (this->_avxEnabled & 1U) != 0;
      IVar7 = 0x1d6;
      if (bVar9) {
        IVar7 = 0x4c1;
      }
      IVar6 = 0x1d3;
      if (bVar9) {
        IVar6 = 0x4c0;
      }
      if (cVar1 == '+') {
        IVar6 = IVar7;
      }
      uVar5 = 0x8000000;
    }
    else {
      bVar9 = (this->_avxEnabled & 1U) != 0;
      IVar7 = 0x1d9;
      if (bVar9) {
        IVar7 = 0x4c5;
      }
      IVar6 = 0x1bc;
      if (bVar9) {
        IVar6 = 0x4aa;
      }
      if (cVar1 == '*') {
        IVar6 = IVar7;
      }
      uVar5 = 0x4000000;
    }
    if ((uVar2._0_4_ & 7) == 2) {
      dst.super_Operand_._signature._bits = uVar2._0_4_ & 0xfffffa | uVar5;
    }
    IVar7 = IVar6;
    if ((uVar3._0_4_ & 7) != 2) break;
    uVar2._0_4_ = uVar3._0_4_ & 0xfffffa | uVar5;
LAB_0013d604:
    src.super_Operand_._signature._bits = uVar2._0_4_;
    IVar7 = IVar6;
    break;
  case _kMaskStart:
    IVar7 = 0x165;
    break;
  case kMask16:
    IVar7 = 0x168;
    break;
  case kMask32:
    IVar7 = 0x166;
    break;
  case _kMaskEnd:
    IVar7 = 0x167;
    break;
  case _kMmxStart:
    IVar7 = 0x1bc;
    if (bVar8 != 0) break;
  case _kMmxEnd:
    IVar7 = 0x1d3;
  }
  this_00 = (this->super_BaseEmitHelper)._emitter;
  this_00->_inlineComment = comment;
  EVar4 = BaseEmitter::_emitI(this_00,IVar7,&dst.super_Operand_,&src.super_Operand_);
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.as<Mem>().size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.as<Mem>().size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}